

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopUnrollCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopUnrollCase *this,bool optimized)

{
  int iVar1;
  CaseShaderType shaderType;
  mapped_type *pmVar2;
  CaseType caseType;
  CaseShaderType shaderType_00;
  undefined7 in_register_00000011;
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  res;
  string repetition;
  allocator<char> local_19a;
  allocator<char> local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  int local_104;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0 [32];
  key_type local_80;
  StringTemplate local_60;
  string local_40;
  
  caseType = (CaseType)CONCAT71(in_register_00000011,optimized);
  if (caseType == CASETYPE_INDEPENDENT) {
    iVar1 = this->m_numRepetitions;
    Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
              (&local_c0,(LoopUnrollCase *)(ulong)this->m_caseType,CASETYPE_INDEPENDENT);
    local_104 = iVar1;
    de::toString<int>(&local_e0,&local_104);
    std::operator+(&local_198,"\tfor (int i = 0; i < ",&local_e0);
    std::operator+(&local_158,&local_198,"; i++)\n\t\t");
    tcu::StringTemplate::StringTemplate(&local_60,&local_c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"NDX",&local_199);
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"i",&local_19a);
    local_138._24_8_ = local_138 + 8;
    local_138._8_4_ = _S_red;
    local_138._16_8_ = 0;
    local_110 = 0;
    local_118 = (_Base_ptr)local_138._24_8_;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_138,&local_80);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    tcu::StringTemplate::specialize
              (&local_40,&local_60,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_138);
    std::operator+(&local_178,&local_158,&local_40);
    std::operator+(&local_100,&local_178,";\n");
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_40);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_138);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    tcu::StringTemplate::~StringTemplate(&local_60);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = &local_c0;
  }
  else {
    Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
              (&local_158,(LoopUnrollCase *)(ulong)this->m_caseType,caseType);
    std::operator+(&local_178,"\t",&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_178,";\n");
    iVar1 = this->m_numRepetitions;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_e0);
    repeatIndexedTemplate(&local_100,(string *)local_138,iVar1,&local_198,0);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = &local_158;
  }
  std::__cxx11::string::~string((string *)this_00);
  shaderType = (this->super_ShaderOptimizationCase).m_caseShaderType;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&local_198,(_anonymous_namespace_ *)(ulong)shaderType,shaderType_00);
  std::operator+(&local_158,"\t",&local_198);
  std::operator+(&local_178,&local_158," vec4 valueOrig = value;\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_178,&local_100);
  defaultProgramData(__return_storage_ptr__,shaderType,(string *)local_138);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string repetition = optimized ? repeatIndexedTemplate("\t" + expressionTemplate(m_caseType) + ";\n", m_numRepetitions)
											: loop(m_numRepetitions, expressionTemplate(m_caseType));

		return defaultProgramData(m_caseShaderType, "\t" + getShaderPrecision(m_caseShaderType) + " vec4 valueOrig = value;\n" + repetition);
	}